

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  CType *pCVar1;
  CTInfo CVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  MSize local_34;
  
  uVar7 = (ulong)len;
  __n = (size_t)sz;
  if (len == 1) {
    iVar3 = lj_cconv_multi_init(cts,d,o);
    if (iVar3 == 0) {
      lj_cconv_ct_tv(cts,d,dp,o,0);
      return;
    }
  }
  else if (len == 0) goto LAB_00146311;
  uVar4 = d->info >> 0x1c;
  if (uVar4 == 1) {
    local_34 = 0;
    memset(dp,0,__n);
    cconv_substruct_init(cts,d,dp,o,len,&local_34);
    if (len <= local_34) {
      return;
    }
    cconv_err_initov(cts,d);
  }
  if (uVar4 == 3) {
    pCVar1 = cts->tab;
    CVar2 = d->info;
    uVar4 = pCVar1[(ushort)CVar2].size;
    if (uVar4 * len <= sz) {
      if (len == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          lj_cconv_ct_tv(cts,pCVar1 + (ushort)CVar2,dp + uVar6,o,0);
          uVar6 = (ulong)((int)uVar6 + uVar4);
          o = o + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar5 = (uint)uVar6;
      if (uVar5 == uVar4) {
        while (uVar5 < sz) {
          memcpy(dp + uVar6,dp,(ulong)uVar4);
          uVar5 = (int)uVar6 + uVar4;
          uVar6 = (ulong)uVar5;
        }
        return;
      }
      dp = dp + uVar6;
      __n = (size_t)(sz - uVar5);
LAB_00146311:
      memset(dp,0,__n);
      return;
    }
  }
  cconv_err_initov(cts,d);
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}